

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
toml::Value::ValueConverter<std::vector<int,_std::allocator<int>_>_>::to
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,
          ValueConverter<std::vector<int,_std::allocator<int>_>_> *this,Value *v)

{
  Type type;
  pointer pVVar1;
  iterator __position;
  int iVar2;
  Array *pAVar3;
  Value *element;
  pointer pVVar4;
  char *local_38;
  char *local_30;
  
  pAVar3 = ValueConverter<std::vector<toml::Value,_std::allocator<toml::Value>_>_>::to
                     ((ValueConverter<std::vector<toml::Value,_std::allocator<toml::Value>_>_> *)
                      &local_38,v);
  pVVar4 = (pAVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar4 == (pAVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    type = pVVar4->type_;
    if (type != INT_TYPE) {
      local_38 = typeToString(type);
      local_30 = "int";
      failwith<char_const(&)[27],char_const*,char_const(&)[6],char_const*,char_const(&)[15]>
                ((char (*) [27])"type error: this value is ",&local_38,(char (*) [6])" but ",
                 &local_30,(char (*) [15])" was requested");
    }
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pVVar4 = (pAVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pVVar1 = (pAVar3->super__Vector_base<toml::Value,_std::allocator<toml::Value>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pVVar4 != pVVar1) {
      do {
        iVar2 = ValueConverter<int>::to((ValueConverter<int> *)&local_30,pVVar4);
        local_38 = (char *)CONCAT44(local_38._4_4_,iVar2);
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (__return_storage_ptr__,__position,(int *)&local_38);
        }
        else {
          *__position._M_current = iVar2;
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        pVVar4 = pVVar4 + 1;
      } while (pVVar4 != pVVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> to(const Value& v)
    {
        const Array& array = v.as<Array>();
        if (array.empty())
            return std::vector<T>();
        array.front().assureType<T>();

        std::vector<T> result;
        for (const auto& element : array) {
            result.push_back(element.as<T>());
        }

        return result;
    }